

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_inertial_and_magnetic_data.cpp
# Opt level: O0

Vector3f __thiscall
ximu::CalInertialAndMagneticData::accelerometer(CalInertialAndMagneticData *this)

{
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vector3f VVar1;
  CalInertialAndMagneticData *this_local;
  
  Vector3<float>::Vector3(&this->_gyroscope,(Vector3<float> *)(in_RSI + 0xc));
  VVar1._z = in_XMM1_Da;
  VVar1._x = (float)(int)extraout_XMM0_Qa;
  VVar1._y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar1;
}

Assistant:

Vector3f CalInertialAndMagneticData::accelerometer() const {
  return _accelerometer;
}